

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
SMBusSimulationDataGenerator::OutputWriteWord
          (SMBusSimulationDataGenerator *this,U8 command,U16 data_word)

{
  U8 byte;
  byte bVar1;
  byte bVar2;
  bool bVar3;
  U8 pec;
  U16 data_word_local;
  U8 command_local;
  SMBusSimulationDataGenerator *this_local;
  
  OutputStart(this);
  bVar1 = OutputAddr(this,'C',false,true);
  bVar1 = ""[(int)(uint)bVar1];
  bVar2 = OutputByte(this,command,true);
  bVar1 = ""[(int)(uint)(bVar1 ^ bVar2)];
  bVar2 = OutputByte(this,(U8)(data_word >> 8),true);
  bVar1 = ""[(int)(uint)(bVar1 ^ bVar2)];
  bVar3 = SMBusAnalyzerSettings::CalcPEC(this->mSettings);
  bVar2 = OutputByte(this,(U8)data_word,bVar3);
  byte = ""[(int)(uint)(bVar1 ^ bVar2)];
  bVar3 = SMBusAnalyzerSettings::CalcPEC(this->mSettings);
  if (bVar3) {
    OutputByte(this,byte,false);
  }
  OutputStop(this);
  AdvanceAllBySec(this,0.0005);
  return;
}

Assistant:

void SMBusSimulationDataGenerator::OutputWriteWord( U8 command, U16 data_word )
{
    U8 pec = 0;

    OutputStart();
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x43, false ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( command ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( U8( data_word >> 8 ) ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( U8( data_word & 0xff ), mSettings->CalcPEC() ) ];
    if( mSettings->CalcPEC() )
        OutputByte( pec, false );
    OutputStop();

    AdvanceAllBySec( ONE_MS * 0.5 );
}